

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O1

void * private_ACUtils_ADynArray_construct(size_t typeSize)

{
  undefined8 *__ptr;
  void *pvVar1;
  private_ACUtils_DynArray_Prototype *prototype;
  
  __ptr = (undefined8 *)malloc(0x30);
  if (__ptr != (undefined8 *)0x0) {
    *__ptr = realloc;
    __ptr[1] = free;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[4] = 0;
    __ptr[5] = 0;
    __ptr[2] = private_ACUtils_ADynArray_growStrategyDefault;
    __ptr[3] = 0;
    __ptr[4] = 8;
    pvVar1 = malloc(typeSize << 3);
    __ptr[5] = pvVar1;
    if (pvVar1 == (void *)0x0) {
      free((void *)0x0);
      free(__ptr);
      __ptr = (undefined8 *)0x0;
    }
  }
  return __ptr;
}

Assistant:

ACUTILS_HD_FUNC void* private_ACUtils_ADynArray_construct(size_t typeSize)
{
    return private_ACUtils_ADynArray_constructWithAllocator(typeSize, realloc, free);
}